

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

string * __thiscall
QPDF::getKeyForObject_abi_cxx11_
          (string *__return_storage_ptr__,QPDF *this,shared_ptr<QPDF::EncryptionParameters> *encp,
          QPDFObjGen og,bool use_aes)

{
  int generation;
  logic_error *this_00;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  int in_stack_ffffffffffffffb8;
  string local_40;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(char *)&(_Var1._M_head_impl)->log != '\0') {
    generation = (int)((ulong)encp >> 0x20);
    if ((*(int *)((long)&(_Var1._M_head_impl)->last_object_description + 0x10) != (int)encp) ||
       (*(int *)((long)&(_Var1._M_head_impl)->last_object_description + 0x14) != generation)) {
      compute_data_key(&local_40,(string *)((long)&(_Var1._M_head_impl)->tokenizer + 0x78),(int)encp
                       ,generation,og.obj._0_1_,*(int *)((long)&(_Var1._M_head_impl)->log + 4),
                       in_stack_ffffffffffffffb8);
      std::__cxx11::string::operator=
                ((string *)
                 &((this->m)._M_t.
                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                   super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file,
                 (string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)&((this->m)._M_t.
                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                   super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                  last_object_description + 0x10))->_M_allocated_capacity = (size_type)encp;
      _Var1._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    }
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&(_Var1._M_head_impl)->file);
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"request for encryption key in non-encrypted PDF");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::string
QPDF::getKeyForObject(std::shared_ptr<EncryptionParameters> encp, QPDFObjGen og, bool use_aes)
{
    if (!encp->encrypted) {
        throw std::logic_error("request for encryption key in non-encrypted PDF");
    }

    if (og != encp->cached_key_og) {
        encp->cached_object_encryption_key = compute_data_key(
            encp->encryption_key,
            og.getObj(),
            og.getGen(),
            use_aes,
            encp->encryption_V,
            encp->encryption_R);
        encp->cached_key_og = og;
    }

    return encp->cached_object_encryption_key;
}